

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

array<std::byte,_2UL>
imageio::bit_cast<std::array<std::byte,2ul>,unsigned_short>(unsigned_short *src)

{
  unsigned_short *src_local;
  array<std::byte,_2UL> dst;
  
  return (array<std::byte,_2UL>)(_Type)*src;
}

Assistant:

[[nodiscard]] constexpr inline To bit_cast(const From& src) noexcept {
    static_assert(sizeof(To) == sizeof(From));
    static_assert(std::is_trivially_copyable_v<From>);
    static_assert(std::is_trivially_copyable_v<To>);
    static_assert(std::is_trivially_constructible_v<To>);
    To dst;
    std::memcpy(&dst, &src, sizeof(To));
    return dst;
}